

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O2

void __thiscall Exception::~Exception(Exception *this)

{
  *(undefined ***)this = &PTR__Exception_0011ad78;
  if (this->err_msg != (char *)0x0) {
    operator_delete__(this->err_msg);
  }
  std::__cxx11::string::~string((string *)&this->err_word);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

Exception::~Exception() {
    delete []err_msg;
}